

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bp.cpp
# Opt level: O0

Complex __thiscall libDAI::BP::logZ(BP *this)

{
  ulong uVar1;
  long *plVar2;
  ulong uVar3;
  nb_type *this_00;
  size_type sVar4;
  long *in_RDI;
  double __r;
  undefined1 auVar5 [64];
  undefined8 uVar6;
  undefined1 auVar7 [16];
  Complex CVar8;
  undefined1 auVar9 [16];
  size_t unaff_retaddr;
  BP *in_stack_00000008;
  size_t I;
  size_t i;
  Complex sum;
  complex<double> *in_stack_fffffffffffffeb8;
  FactorGraph *in_stack_fffffffffffffec0;
  ulong local_a0;
  size_t in_stack_ffffffffffffff70;
  BP *in_stack_ffffffffffffff78;
  complex<double> local_40;
  undefined8 local_30;
  double local_28;
  ulong local_20;
  complex<double> local_10;
  undefined1 extraout_var [56];
  
  std::complex<double>::complex(&local_10,0.0,0.0);
  local_20 = 0;
  while( true ) {
    uVar1 = local_20;
    plVar2 = (long *)(**(code **)(*in_RDI + 0x20))();
    uVar3 = (**(code **)(*plVar2 + 0x28))();
    auVar9._8_8_ = in_stack_fffffffffffffeb8;
    auVar9._0_8_ = in_stack_fffffffffffffec0;
    if (uVar3 <= uVar1) break;
    auVar5._0_8_ = (**(code **)(*in_RDI + 0x20))();
    auVar5._8_56_ = extraout_var;
    auVar9 = auVar5._0_16_;
    this_00 = FactorGraph::nbV(in_stack_fffffffffffffec0,(size_t)in_stack_fffffffffffffeb8);
    sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(this_00);
    auVar9 = vcvtusi2sd_avx512f(auVar9,sVar4);
    __r = 1.0 - auVar9._0_8_;
    uVar6 = 0;
    std::complex<double>::complex(&local_40,__r,0.0);
    beliefV(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    TFactor<double>::entropy((TFactor<double> *)0xb21c31);
    std::operator*(in_stack_fffffffffffffeb8,(complex<double> *)0xb21c72);
    local_30 = uVar6;
    local_28 = __r;
    std::complex<double>::operator+=
              ((complex<double> *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffffec0);
    local_20 = local_20 + 1;
  }
  local_a0 = 0;
  while( true ) {
    plVar2 = (long *)(**(code **)(*in_RDI + 0x20))();
    auVar7 = (**(code **)(*plVar2 + 0x48))();
    CVar8._M_value._8_8_ = auVar7._8_8_;
    if (auVar7._0_8_ <= local_a0) break;
    beliefF(in_stack_00000008,unaff_retaddr);
    plVar2 = (long *)(**(code **)(*in_RDI + 0x20))();
    auVar7 = auVar9;
    auVar9 = (**(code **)(*plVar2 + 0x50))(plVar2,local_a0);
    KL_dist<double>(auVar7._0_8_,auVar7._8_8_);
    std::complex<double>::operator-=(auVar9._0_8_,auVar9._8_8_);
    TFactor<double>::~TFactor(auVar9._0_8_);
    local_a0 = local_a0 + 1;
  }
  CVar8._M_value._0_8_ = local_a0;
  return (Complex)CVar8._M_value;
}

Assistant:

Complex BP::logZ() const {
        Complex sum = 0.0;
        for(size_t i = 0; i < grm().nrVars(); i++ )
            sum += Complex(1.0 - grm().nbV(i).size()) * beliefV(i).entropy();
        for( size_t I = 0; I < grm().nrFactors(); I++ )
            sum -= KL_dist( beliefF(I), grm().factor(I) );
        return sum;
    }